

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlNewReference(xmlDoc *doc,xmlChar *name)

{
  int len;
  xmlNodePtr pxVar1;
  xmlChar *name_00;
  xmlEntityPtr pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  
  if (name == (xmlChar *)0x0) {
    pxVar1 = (xmlNodePtr)0x0;
  }
  else {
    pxVar1 = (xmlNodePtr)(*xmlMalloc)(0x78);
    if (pxVar1 == (xmlNodePtr)0x0) {
      pxVar1 = (xmlNodePtr)0x0;
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"building reference");
    }
    else {
      pxVar1->_private = (void *)0x0;
      *(undefined8 *)&pxVar1->type = 0;
      pxVar1->doc = (_xmlDoc *)0x0;
      pxVar1->ns = (xmlNs *)0x0;
      pxVar1->nsDef = (xmlNs *)0x0;
      pxVar1->psvi = (void *)0x0;
      pxVar1->content = (xmlChar *)0x0;
      pxVar1->properties = (_xmlAttr *)0x0;
      pxVar1->next = (_xmlNode *)0x0;
      pxVar1->prev = (_xmlNode *)0x0;
      pxVar1->last = (_xmlNode *)0x0;
      pxVar1->parent = (_xmlNode *)0x0;
      pxVar1->name = (xmlChar *)0x0;
      pxVar1->children = (_xmlNode *)0x0;
      pxVar1->line = 0;
      pxVar1->extra = 0;
      *(undefined4 *)&pxVar1->field_0x74 = 0;
      pxVar1->type = XML_ENTITY_REF_NODE;
      pxVar1->doc = doc;
      if (*name == '&') {
        len = xmlStrlen(name + 1);
        if (name[len] == ';') {
          len = len + -1;
        }
        name_00 = xmlStrndup(name + 1,len);
      }
      else {
        name_00 = xmlStrdup(name);
      }
      pxVar1->name = name_00;
      pxVar2 = xmlGetDocEntity(doc,name_00);
      if (pxVar2 != (xmlEntityPtr)0x0) {
        pxVar1->content = pxVar2->content;
        pxVar1->children = (_xmlNode *)pxVar2;
        pxVar1->last = (_xmlNode *)pxVar2;
      }
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var3 = __xmlRegisterNodeDefaultValue(), *pp_Var3 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var3 = __xmlRegisterNodeDefaultValue();
        (**pp_Var3)(pxVar1);
      }
    }
  }
  return pxVar1;
}

Assistant:

xmlNodePtr
xmlNewReference(const xmlDoc *doc, const xmlChar *name) {
    xmlNodePtr cur;
    xmlEntityPtr ent;

    if (name == NULL)
        return(NULL);

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building reference");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_ENTITY_REF_NODE;

    cur->doc = (xmlDoc *)doc;
    if (name[0] == '&') {
        int len;
        name++;
	len = xmlStrlen(name);
	if (name[len - 1] == ';')
	    cur->name = xmlStrndup(name, len - 1);
	else
	    cur->name = xmlStrndup(name, len);
    } else
	cur->name = xmlStrdup(name);

    ent = xmlGetDocEntity(doc, cur->name);
    if (ent != NULL) {
	cur->content = ent->content;
	/*
	 * The parent pointer in entity is a DTD pointer and thus is NOT
	 * updated.  Not sure if this is 100% correct.
	 *  -George
	 */
	cur->children = (xmlNodePtr) ent;
	cur->last = (xmlNodePtr) ent;
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}